

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalar_replacement_pass.cpp
# Opt level: O3

bool __thiscall
spvtools::opt::ScalarReplacementPass::ReplaceAccessChain
          (ScalarReplacementPass *this,Instruction *chain,
          vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
          *replacements)

{
  Op op;
  IRContext *pIVar1;
  pointer ppIVar2;
  undefined8 uVar3;
  bool bVar4;
  uint32_t uVar5;
  uint32_t uVar6;
  Instruction *pIVar7;
  Constant *this_00;
  int64_t iVar8;
  Instruction *this_01;
  Operand *pOVar9;
  BasicBlock *pBVar10;
  mapped_type *ppBVar11;
  uint uVar12;
  iterator chainIter;
  iterator iter;
  undefined1 local_b8 [40];
  __uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  local_90;
  Instruction *local_88;
  IRContext *local_80;
  _Head_base<0UL,_spvtools::opt::Instruction_*,_false> local_78;
  undefined1 local_70 [32];
  _Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false> local_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  
  uVar12 = (chain->has_result_id_ & 1) + 1;
  if (chain->has_type_id_ == false) {
    uVar12 = (uint)chain->has_result_id_;
  }
  uVar5 = Instruction::GetSingleWordOperand(chain,uVar12 + 1);
  pIVar1 = (this->super_MemPass).super_Pass.context_;
  if ((pIVar1->valid_analyses_ & kAnalysisBegin) == kAnalysisNone) {
    IRContext::BuildDefUseManager(pIVar1);
  }
  pIVar7 = analysis::DefUseManager::GetDef
                     ((pIVar1->def_use_mgr_)._M_t.
                      super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                      .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>.
                      _M_head_impl,uVar5);
  pIVar1 = (this->super_MemPass).super_Pass.context_;
  if ((pIVar1->valid_analyses_ & kAnalysisConstants) == kAnalysisNone) {
    IRContext::BuildConstantManager(pIVar1);
  }
  this_00 = analysis::ConstantManager::GetConstantFromInst
                      ((pIVar1->constant_mgr_)._M_t.
                       super___uniq_ptr_impl<spvtools::opt::analysis::ConstantManager,_std::default_delete<spvtools::opt::analysis::ConstantManager>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_spvtools::opt::analysis::ConstantManager_*,_std::default_delete<spvtools::opt::analysis::ConstantManager>_>
                       .super__Head_base<0UL,_spvtools::opt::analysis::ConstantManager_*,_false>.
                       _M_head_impl,pIVar7);
  iVar8 = analysis::Constant::GetSignExtendedValue(this_00);
  if ((iVar8 < 0) ||
     (ppIVar2 = (replacements->
                super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                )._M_impl.super__Vector_impl_data._M_start,
     (long)(replacements->
           super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
           )._M_impl.super__Vector_impl_data._M_finish - (long)ppIVar2 >> 3 <= iVar8)) {
LAB_00534429:
    bVar4 = false;
  }
  else {
    pIVar7 = ppIVar2[iVar8];
    bVar4 = chain->has_result_id_;
    uVar12 = (bVar4 & 1) + 1;
    if (chain->has_type_id_ == false) {
      uVar12 = (uint)bVar4;
    }
    if ((int)((ulong)((long)(chain->operands_).
                            super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                     (long)(chain->operands_).
                           super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                           ._M_impl.super__Vector_impl_data._M_start) >> 4) * -0x55555555 - uVar12 <
        3) {
      pIVar1 = (this->super_MemPass).super_Pass.context_;
      uVar6 = 0;
      uVar5 = 0;
      if ((bVar4 & 1U) != 0) {
        uVar5 = Instruction::GetSingleWordOperand(chain,(uint)chain->has_type_id_);
      }
      if (pIVar7->has_result_id_ == true) {
        uVar6 = Instruction::GetSingleWordOperand(pIVar7,(uint)pIVar7->has_type_id_);
      }
      IRContext::ReplaceAllUsesWith(pIVar1,uVar5,uVar6);
    }
    else {
      local_78._M_head_impl = chain;
      uVar5 = Pass::TakeNextId((Pass *)this);
      if (uVar5 == 0) goto LAB_00534429;
      this_01 = (Instruction *)operator_new(0x70);
      local_80 = (this->super_MemPass).super_Pass.context_;
      op = chain->opcode_;
      local_70[0x10] = '\0';
      local_70[0x11] = '\0';
      local_70[0x12] = '\0';
      local_70[0x13] = '\0';
      uVar6 = 0;
      if (chain->has_type_id_ == true) {
        uVar6 = Instruction::GetSingleWordOperand(chain,0);
      }
      if (pIVar7->has_result_id_ == true) {
        local_70._16_4_ = Instruction::GetSingleWordOperand(pIVar7,(uint)pIVar7->has_type_id_);
      }
      local_70._24_8_ = local_70 + 0x10;
      local_70._0_8_ = &PTR__SmallVector_00930a20;
      local_50._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
      local_70._8_8_ = 1;
      local_b8._0_4_ = SPV_OPERAND_TYPE_ID;
      local_b8._8_8_ = &PTR__SmallVector_00930a20;
      local_b8._16_8_ = 0;
      local_b8._32_8_ = local_b8 + 0x18;
      local_90._M_t.
      super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      .super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>.
      _M_head_impl = (tuple<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                      )(_Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                        )0x0;
      utils::SmallVector<unsigned_int,_2UL>::operator=
                ((SmallVector<unsigned_int,_2UL> *)(local_b8 + 8),
                 (SmallVector<unsigned_int,_2UL> *)local_70);
      local_48 = 0;
      uStack_40 = 0;
      local_38 = 0;
      std::vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>>::
      _M_range_initialize<spvtools::opt::Operand_const*>
                ((vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>> *)&local_48,
                 local_b8,&local_88);
      Instruction::Instruction(this_01,local_80,op,uVar6,uVar5,(OperandList *)&local_48);
      local_88 = this_01;
      std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::~vector
                ((vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *)
                 &local_48);
      local_b8._8_8_ = &PTR__SmallVector_00930a20;
      if (local_90._M_t.
          super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
          .super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>.
          _M_head_impl !=
          (_Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
           )0x0) {
        std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
                  ((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                   &local_90,
                   (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                   local_90._M_t.
                   super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                   .
                   super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
                   ._M_head_impl);
      }
      local_90._M_t.
      super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      .super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>.
      _M_head_impl = (tuple<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                      )(_Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                        )0x0;
      local_70._0_8_ = &PTR__SmallVector_00930a20;
      if (local_50._M_head_impl != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
        std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
                  ((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                   &local_50,local_50._M_head_impl);
      }
      uVar12 = (chain->has_result_id_ & 1) + 1;
      if (chain->has_type_id_ == false) {
        uVar12 = (uint)chain->has_result_id_;
      }
      if (2 < (int)((ulong)((long)(chain->operands_).
                                  super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(chain->operands_).
                                 super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                 ._M_impl.super__Vector_impl_data._M_start) >> 4) * -0x55555555 -
              uVar12) {
        uVar6 = 2;
        do {
          pOVar9 = Instruction::GetInOperand(chain,uVar6);
          local_b8._0_4_ = pOVar9->type;
          local_b8._8_8_ = &PTR__SmallVector_00930a20;
          local_b8._16_8_ = 0;
          local_b8._32_8_ = local_b8 + 0x18;
          local_90._M_t.
          super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
          .super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>.
          _M_head_impl = (tuple<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                          )(_Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                            )0x0;
          utils::SmallVector<unsigned_int,_2UL>::operator=
                    ((SmallVector<unsigned_int,_2UL> *)(local_b8 + 8),&pOVar9->words);
          std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::
          emplace_back<spvtools::opt::Operand>(&this_01->operands_,(Operand *)local_b8);
          local_b8._8_8_ = &PTR__SmallVector_00930a20;
          if ((_Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               )local_90._M_t.
                super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                .
                super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
                ._M_head_impl != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
            std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::
            operator()((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                       &local_90,
                       (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                       local_90._M_t.
                       super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                       .
                       super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
                       ._M_head_impl);
          }
          uVar6 = uVar6 + 1;
          uVar12 = (chain->has_result_id_ & 1) + 1;
          if (chain->has_type_id_ == false) {
            uVar12 = (uint)chain->has_result_id_;
          }
        } while (uVar6 < (int)((ulong)((long)(chain->operands_).
                                             super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                             ._M_impl.super__Vector_impl_data._M_finish -
                                      (long)(chain->operands_).
                                            super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                            ._M_impl.super__Vector_impl_data._M_start) >> 4) *
                         -0x55555555 - uVar12);
      }
      Instruction::UpdateDebugInfoFrom(this_01,chain);
      InstructionList::iterator::InsertBefore
                ((iterator *)local_70,
                 (unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                  *)&local_78);
      pIVar1 = (this->super_MemPass).super_Pass.context_;
      if ((pIVar1->valid_analyses_ & kAnalysisBegin) == kAnalysisNone) {
        IRContext::BuildDefUseManager(pIVar1);
      }
      analysis::DefUseManager::AnalyzeInstDefUse
                ((pIVar1->def_use_mgr_)._M_t.
                 super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                 .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>.
                 _M_head_impl,(Instruction *)local_70._0_8_);
      uVar3 = local_70._0_8_;
      pIVar1 = (this->super_MemPass).super_Pass.context_;
      pBVar10 = IRContext::get_instr_block(pIVar1,chain);
      local_b8._0_8_ = uVar3;
      if ((pIVar1->valid_analyses_ & kAnalysisInstrToBlockMapping) != kAnalysisNone) {
        ppBVar11 = std::__detail::
                   _Map_base<spvtools::opt::Instruction_*,_std::pair<spvtools::opt::Instruction_*const,_spvtools::opt::BasicBlock_*>,_std::allocator<std::pair<spvtools::opt::Instruction_*const,_spvtools::opt::BasicBlock_*>_>,_std::__detail::_Select1st,_std::equal_to<spvtools::opt::Instruction_*>,_std::hash<spvtools::opt::Instruction_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                   ::operator[]((_Map_base<spvtools::opt::Instruction_*,_std::pair<spvtools::opt::Instruction_*const,_spvtools::opt::BasicBlock_*>,_std::allocator<std::pair<spvtools::opt::Instruction_*const,_spvtools::opt::BasicBlock_*>_>,_std::__detail::_Select1st,_std::equal_to<spvtools::opt::Instruction_*>,_std::hash<spvtools::opt::Instruction_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                 *)&pIVar1->instr_to_block_,(key_type *)local_b8);
        *ppBVar11 = pBVar10;
      }
      pIVar1 = (this->super_MemPass).super_Pass.context_;
      uVar6 = 0;
      if (chain->has_result_id_ == true) {
        uVar6 = Instruction::GetSingleWordOperand(chain,(uint)chain->has_type_id_);
      }
      IRContext::ReplaceAllUsesWith(pIVar1,uVar6,uVar5);
      if (local_88 != (Instruction *)0x0) {
        (*(local_88->super_IntrusiveNodeBase<spvtools::opt::Instruction>)._vptr_IntrusiveNodeBase[1]
        )();
      }
    }
    bVar4 = true;
  }
  return bVar4;
}

Assistant:

bool ScalarReplacementPass::ReplaceAccessChain(
    Instruction* chain, const std::vector<Instruction*>& replacements) {
  // Replaces the access chain with either another access chain (with one fewer
  // indexes) or a direct use of the replacement variable.
  uint32_t indexId = chain->GetSingleWordInOperand(1u);
  const Instruction* index = get_def_use_mgr()->GetDef(indexId);
  int64_t indexValue = context()
                           ->get_constant_mgr()
                           ->GetConstantFromInst(index)
                           ->GetSignExtendedValue();
  if (indexValue < 0 ||
      indexValue >= static_cast<int64_t>(replacements.size())) {
    // Out of bounds access, this is illegal IR.  Notice that OpAccessChain
    // indexing is 0-based, so we should also reject index == size-of-array.
    return false;
  } else {
    const Instruction* var = replacements[static_cast<size_t>(indexValue)];
    if (chain->NumInOperands() > 2) {
      // Replace input access chain with another access chain.
      BasicBlock::iterator chainIter(chain);
      uint32_t replacementId = TakeNextId();
      if (replacementId == 0) {
        return false;
      }
      std::unique_ptr<Instruction> replacementChain(new Instruction(
          context(), chain->opcode(), chain->type_id(), replacementId,
          std::initializer_list<Operand>{
              {SPV_OPERAND_TYPE_ID, {var->result_id()}}}));
      // Add the remaining indexes.
      for (uint32_t i = 2; i < chain->NumInOperands(); ++i) {
        Operand copy(chain->GetInOperand(i));
        replacementChain->AddOperand(std::move(copy));
      }
      replacementChain->UpdateDebugInfoFrom(chain);
      auto iter = chainIter.InsertBefore(std::move(replacementChain));
      get_def_use_mgr()->AnalyzeInstDefUse(&*iter);
      context()->set_instr_block(&*iter, context()->get_instr_block(chain));
      context()->ReplaceAllUsesWith(chain->result_id(), replacementId);
    } else {
      // Replace with a use of the variable.
      context()->ReplaceAllUsesWith(chain->result_id(), var->result_id());
    }
  }

  return true;
}